

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_multi.cc
# Opt level: O3

void learn(log_multi *b,single_learner *base,example *ec)

{
  uint32_t *puVar1;
  uint uVar2;
  node *pnVar3;
  bool bVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  uint32_t in_R9D;
  uint32_t label;
  float fVar8;
  uint32_t cn;
  uint32_t class_index;
  uint32_t local_40;
  float local_3c;
  float local_38;
  uint32_t local_34;
  
  label = (ec->l).multi.label;
  if ((label == 0xffffffff) || (b->progress == true)) {
    predict(b,base,ec);
    label = (ec->l).multi.label;
    if (label == 0xffffffff) {
      return;
    }
  }
  local_38 = (ec->l).simple.weight;
  fVar8 = (ec->pred).scalar;
  uVar6 = 0;
  local_34 = 0;
  (ec->l).cs.costs._begin = (wclass *)0x7f7fffff;
  (ec->l).simple.initial = 0.0;
  local_40 = 0;
  bVar4 = children(b,&local_40,&local_34,label);
  if (bVar4) {
    local_3c = fVar8;
    do {
      train_node(b,base,ec,&local_40,&local_34,in_R9D);
      uVar2 = (&(b->nodes)._begin[uVar6].left)[0.0 < (ec->pred).scalar || (ec->pred).scalar == 0.0];
      uVar6 = (ulong)uVar2;
      local_40 = uVar2;
      bVar4 = children(b,&local_40,&local_34,label);
    } while (bVar4);
    puVar1 = &(b->nodes)._begin[uVar6].min_count;
    *puVar1 = *puVar1 + 1;
    while (fVar8 = local_3c, uVar2 != 0) {
      pnVar3 = (b->nodes)._begin;
      uVar2 = pnVar3[uVar6].parent;
      uVar7 = (ulong)uVar2;
      if (pnVar3[uVar7].min_count == pnVar3[uVar6].min_count) break;
      uVar5 = pnVar3[pnVar3[uVar7].left].min_count;
      if (pnVar3[pnVar3[uVar7].right].min_count < pnVar3[pnVar3[uVar7].left].min_count) {
        uVar5 = pnVar3[pnVar3[uVar7].right].min_count;
      }
      pnVar3[uVar7].min_count = uVar5;
      uVar6 = uVar7;
    }
  }
  else {
    puVar1 = &((b->nodes)._begin)->min_count;
    *puVar1 = *puVar1 + 1;
  }
  (ec->pred).scalar = fVar8;
  (ec->l).multi.label = label;
  (ec->l).simple.weight = local_38;
  return;
}

Assistant:

void learn(log_multi& b, single_learner& base, example& ec)
{
  //    verify_min_dfs(b, b.nodes[0]);
  if (ec.l.multi.label == (uint32_t)-1 || b.progress)
    predict(b, base, ec);

  if (ec.l.multi.label != (uint32_t)-1)  // if training the tree
  {
    MULTICLASS::label_t mc = ec.l.multi;
    uint32_t start_pred = ec.pred.multiclass;

    uint32_t class_index = 0;
    ec.l.simple = {FLT_MAX, 0.f, 0.f};
    uint32_t cn = 0;
    uint32_t depth = 0;
    while (children(b, cn, class_index, mc.label))
    {
      train_node(b, base, ec, cn, class_index, depth);
      cn = descend(b.nodes[cn], ec.pred.scalar);
      depth++;
    }

    b.nodes[cn].min_count++;
    update_min_count(b, cn);
    ec.pred.multiclass = start_pred;
    ec.l.multi = mc;
  }
}